

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_minelements(lysp_yang_ctx *ctx,uint32_t *min,uint16_t *flags,lysp_ext_instance **exts)

{
  size_t sVar1;
  LY_ERR LVar2;
  ushort **ppuVar3;
  int *piVar4;
  ulonglong uVar5;
  char *pcVar6;
  char *format;
  ly_ctx *plVar7;
  bool bVar8;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  char *ptr;
  
  buf = (char *)0x0;
  if ((*flags >> 9 & 1) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","min-elements");
    return LY_EVALID;
  }
  *flags = *flags | 0x200;
  LVar2 = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,&word,&buf,&word_len);
  sVar1 = word_len;
  if (LVar2 != LY_SUCCESS) goto LAB_0016f532;
  if (word_len == 0) {
LAB_0016f4c6:
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Invalid value \"%.*s\" of \"%s\".";
    pcVar6 = word;
LAB_0016f527:
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,format,sVar1 & 0xffffffff,pcVar6,"min-elements");
  }
  else {
    ppuVar3 = __ctype_b_loc();
    pcVar6 = word;
    if (((*(byte *)((long)*ppuVar3 + (long)*word * 2 + 1) & 8) == 0) || (sVar1 != 1 && *word == '0')
       ) goto LAB_0016f4c6;
    piVar4 = __errno_location();
    *piVar4 = 0;
    uVar5 = strtoull(pcVar6,&ptr,10);
    if ((long)ptr - (long)pcVar6 != sVar1) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Invalid value \"%.*s\" of \"%s\".";
      goto LAB_0016f527;
    }
    if (uVar5 >> 0x20 != 0 || *piVar4 == 0x22) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Value \"%.*s\" is out of \"%s\" bounds.";
      goto LAB_0016f527;
    }
    *min = (uint32_t)uVar5;
    LVar2 = get_keyword(ctx,&kw,&word,&word_len);
    if (LVar2 != LY_SUCCESS) goto LAB_0016f532;
    if (kw == LY_STMT_SYNTAX_SEMICOLON) {
      bVar8 = true;
LAB_0016f67c:
      while (LVar2 = LY_SUCCESS, !bVar8) {
        if (kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar7 = (ly_ctx *)0x0;
          }
          else {
            plVar7 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar6 = lyplg_ext_stmt2str(kw);
          ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar6,"min-elements");
          goto LAB_0016f52e;
        }
        LVar2 = parse_ext(ctx,word,word_len,min,LY_STMT_MIN_ELEMENTS,0,exts);
        if ((LVar2 != LY_SUCCESS) ||
           (LVar2 = get_keyword(ctx,&kw,&word,&word_len), LVar2 != LY_SUCCESS)) break;
        bVar8 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      goto LAB_0016f532;
    }
    if (kw == LY_STMT_SYNTAX_LEFT_BRACE) {
      LVar2 = get_keyword(ctx,&kw,&word,&word_len);
      if (LVar2 != LY_SUCCESS) goto LAB_0016f532;
      bVar8 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
      goto LAB_0016f67c;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar6 = lyplg_ext_stmt2str(kw);
    ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\".",
            pcVar6);
  }
LAB_0016f52e:
  LVar2 = LY_EVALID;
LAB_0016f532:
  free(buf);
  return LVar2;
}

Assistant:

LY_ERR
parse_minelements(struct lysp_yang_ctx *ctx, uint32_t *min, uint16_t *flags, struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word, *ptr;
    size_t word_len;
    unsigned long long num;
    enum ly_stmt kw;

    if (*flags & LYS_SET_MIN) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "min-elements");
        return LY_EVALID;
    }
    *flags |= LYS_SET_MIN;

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if (!word_len || !isdigit(word[0]) || ((word[0] == '0') && (word_len > 1))) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }

    errno = 0;
    num = strtoull(word, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if ((size_t)(ptr - word) != word_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }
    if ((errno == ERANGE) || (num > UINT32_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, (int)word_len, word, "min-elements");
        ret = LY_EVALID;
        goto cleanup;
    }
    *min = num;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, min, LY_STMT_MIN_ELEMENTS, 0, exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "min-elements");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}